

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O1

void parseUUID(char *uuid,uchar *buffer_out,uint out_size)

{
  char cVar1;
  uchar *puVar2;
  int iVar3;
  size_t __size;
  void *__s;
  ulong uVar4;
  ulong uVar5;
  uchar cur_character;
  byte local_41;
  void *local_40;
  uchar *local_38;
  
  __size = strlen(uuid);
  __s = malloc(__size);
  buffer_out[0] = '\0';
  buffer_out[1] = '\0';
  buffer_out[2] = '\0';
  buffer_out[3] = '\0';
  buffer_out[4] = '\0';
  buffer_out[5] = '\0';
  buffer_out[6] = '\0';
  buffer_out[7] = '\0';
  uVar4 = 0;
  local_38 = buffer_out;
  memset(__s,0,__size);
  if (__size != 0) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      cVar1 = uuid[uVar5];
      iVar3 = isxdigit((int)cVar1);
      if (iVar3 != 0) {
        *(char *)((long)__s + uVar4) = cVar1;
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < __size);
  }
  puVar2 = local_38;
  uVar5 = uVar4;
  if ((uVar4 & 1) != 0) {
    uVar5 = (ulong)((int)uVar4 + 1);
    *(undefined1 *)((long)__s + uVar4) = 0x30;
  }
  *(undefined1 *)((long)__s + uVar5) = 0;
  local_40 = __s;
  if (1 < (uint)uVar5) {
    uVar4 = 0;
    do {
      __isoc99_sscanf(__s,"%2hhx",&local_41);
      puVar2[(uint)uVar4 & 7] = puVar2[(uint)uVar4 & 7] ^ local_41;
      uVar4 = uVar4 + 1;
      __s = (void *)((long)__s + 2);
    } while ((uint)uVar5 >> 1 != uVar4);
  }
  free(local_40);
  return;
}

Assistant:

static void parseUUID(const char *uuid, unsigned char *buffer_out, unsigned int out_size) {
	unsigned int i, j;
	char *hexuuid;
	unsigned char cur_character;
	// remove characters not in hex set
	size_t len = strlen(uuid);
	hexuuid = (char *)malloc(sizeof(char) * len);
	memset(buffer_out, 0, out_size);
	memset(hexuuid, 0, sizeof(char) * len);

	for (i = 0, j = 0; i < len; i++) {
		if (isxdigit(uuid[i])) {
			hexuuid[j] = uuid[i];
			j++;
		} else {
			// skip
			continue;
		}
	}
	if (j % 2 == 1) {
		hexuuid[j++] = '0';
	}
	hexuuid[j] = '\0';
	for (i = 0; i < j / 2; i++) {
		sscanf(&hexuuid[i * 2], "%2hhx", &cur_character);
		buffer_out[i % out_size] = buffer_out[i % out_size] ^ cur_character;
	}

	free(hexuuid);
}